

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  U32 minMatch_00;
  ZSTD_strategy strat;
  BYTE *pBVar1;
  ZSTD_dictMode_e dictMode;
  ZSTD_blockCompressor p_Var2;
  BYTE *pBVar3;
  size_t sVar4;
  BYTE *ip_00;
  long lVar5;
  ulong uVar6;
  BYTE *dst;
  rawSeq rVar7;
  size_t newLitLength;
  int i;
  uint local_118;
  U32 local_10c;
  uint uStack_108;
  rawSeq sequence;
  size_t lastLLSize;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  ZSTD_blockCompressor blockCompressor;
  uint minMatch;
  ZSTD_compressionParameters *cParams;
  void *src_local;
  ZSTD_paramSwitch_e useRowMatchFinder_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  rawSeqStore_t *rawSeqStore_local;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  minMatch_00 = (ms->cParams).minMatch;
  strat = (ms->cParams).strategy;
  dictMode = ZSTD_matchState_dictMode(ms);
  p_Var2 = ZSTD_selectBlockCompressor(strat,useRowMatchFinder,dictMode);
  pBVar3 = (BYTE *)((long)src + srcSize);
  if ((ms->cParams).strategy < ZSTD_btopt) {
    if (rawSeqStore->size < rawSeqStore->pos) {
      __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x2ad,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                   );
    }
    lastLLSize = (size_t)src;
    if (rawSeqStore->capacity < rawSeqStore->size) {
      __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x2ae,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                   );
    }
    for (; rawSeqStore->pos < rawSeqStore->size && lastLLSize < pBVar3;
        lastLLSize = lastLLSize + uStack_108 + (ulong)local_118) {
      ip._0_4_ = (int)pBVar3;
      rVar7 = maybeSplitSequence(rawSeqStore,(int)ip - (int)lastLLSize,minMatch_00);
      local_118 = rVar7.matchLength;
      local_10c = rVar7.offset;
      if (local_10c == 0) break;
      uStack_108 = rVar7.litLength;
      if (pBVar3 < (BYTE *)(lastLLSize + uStack_108 + (ulong)local_118)) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x2b9,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      ZSTD_ldm_limitTableUpdate(ms,(BYTE *)lastLLSize);
      ZSTD_ldm_fillFastTables(ms,(void *)lastLLSize);
      sVar4 = (*p_Var2)(ms,seqStore,rep,(void *)lastLLSize,rVar7._4_8_);
      for (newLitLength._4_4_ = 2; 0 < newLitLength._4_4_;
          newLitLength._4_4_ = newLitLength._4_4_ + -1) {
        rep[newLitLength._4_4_] = rep[newLitLength._4_4_ + -1];
      }
      *rep = local_10c;
      ip_00 = (BYTE *)((lastLLSize + uStack_108) - sVar4);
      if (local_10c == 0) {
        __assert_fail("(sequence.offset)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x2ca,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + sVar4) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar3 < ip_00 + sVar4) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar3 + -0x20 < ip_00 + sVar4) {
        ZSTD_safecopyLiterals(seqStore->lit,ip_00,ip_00 + sVar4,pBVar3 + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,ip_00);
        if (0x10 < sVar4) {
          pBVar1 = seqStore->lit;
          dst = pBVar1 + 0x10;
          lVar5 = (long)dst - (long)(ip_00 + 0x10);
          if ((lVar5 < 0x10) && (-0x10 < lVar5)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(dst,ip_00 + 0x10);
          if (0x10 < (long)(sVar4 - 0x10)) {
            oend = pBVar1 + 0x20;
            do {
              op = ip_00 + 0x20;
              ZSTD_copy16(oend,op);
              ZSTD_copy16(oend + 0x10,ip_00 + 0x30);
              oend = oend + 0x20;
              ip_00 = op;
            } while (oend < dst + (sVar4 - 0x10));
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar4;
      if (0xffff < sVar4) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)sVar4;
      seqStore->sequences->offBase = local_10c + 3;
      if ((ulong)local_118 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar6 = (ulong)local_118 - 3;
      if (0xffff < uVar6) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->mlBase = (U16)uVar6;
      seqStore->sequences = seqStore->sequences + 1;
    }
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)lastLLSize);
    ZSTD_ldm_fillFastTables(ms,(void *)lastLLSize);
    rawSeqStore_local =
         (rawSeqStore_t *)(*p_Var2)(ms,seqStore,rep,(void *)lastLLSize,(long)pBVar3 - lastLLSize);
  }
  else {
    ms->ldmSeqStore = rawSeqStore;
    rawSeqStore_local = (rawSeqStore_t *)(*p_Var2)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
  }
  return (size_t)rawSeqStore_local;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}